

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O0

void __thiscall GlobOptBlockData::ReuseBlockData(GlobOptBlockData *this,GlobOptBlockData *fromData)

{
  bool bVar1;
  GlobOptBlockData *fromData_local;
  GlobOptBlockData *this_local;
  
  this->globOpt = fromData->globOpt;
  this->symToValueMap = fromData->symToValueMap;
  this->exprToValueMap = fromData->exprToValueMap;
  this->liveFields = fromData->liveFields;
  this->liveArrayValues = fromData->liveArrayValues;
  this->maybeWrittenTypeSyms = fromData->maybeWrittenTypeSyms;
  this->isTempSrc = fromData->isTempSrc;
  this->liveVarSyms = fromData->liveVarSyms;
  this->liveInt32Syms = fromData->liveInt32Syms;
  this->liveLossyInt32Syms = fromData->liveLossyInt32Syms;
  this->liveFloat64Syms = fromData->liveFloat64Syms;
  bVar1 = GlobOpt::TrackArgumentsObject(this->globOpt);
  if (bVar1) {
    this->argObjSyms = fromData->argObjSyms;
  }
  this->maybeTempObjectSyms = fromData->maybeTempObjectSyms;
  this->canStoreTempObjectSyms = fromData->canStoreTempObjectSyms;
  this->curFunc = fromData->curFunc;
  this->valuesToKillOnCalls = fromData->valuesToKillOnCalls;
  this->inductionVariables = fromData->inductionVariables;
  this->availableIntBoundChecks = fromData->availableIntBoundChecks;
  this->callSequence = fromData->callSequence;
  this->startCallCount = fromData->startCallCount;
  this->argOutCount = fromData->argOutCount;
  this->totalOutParamCount = fromData->totalOutParamCount;
  this->inlinedArgOutSize = fromData->inlinedArgOutSize;
  this->hasCSECandidates = (bool)(fromData->hasCSECandidates & 1);
  this->stackLiteralInitFldDataMap = fromData->stackLiteralInitFldDataMap;
  this->changedSyms = fromData->changedSyms;
  this->capturedValues = fromData->capturedValues;
  if (this->capturedValues != (CapturedValues *)0x0) {
    CapturedValues::IncrementRefCount(this->capturedValues);
  }
  OnDataReused(this,fromData);
  return;
}

Assistant:

void
GlobOptBlockData::ReuseBlockData(GlobOptBlockData *fromData)
{
    this->globOpt = fromData->globOpt;

    // Reuse dead map
    this->symToValueMap = fromData->symToValueMap;
    this->exprToValueMap = fromData->exprToValueMap;
    this->liveFields = fromData->liveFields;
    this->liveArrayValues = fromData->liveArrayValues;
    this->maybeWrittenTypeSyms = fromData->maybeWrittenTypeSyms;
    this->isTempSrc = fromData->isTempSrc;
    this->liveVarSyms = fromData->liveVarSyms;
    this->liveInt32Syms = fromData->liveInt32Syms;
    this->liveLossyInt32Syms = fromData->liveLossyInt32Syms;
    this->liveFloat64Syms = fromData->liveFloat64Syms;

    if (this->globOpt->TrackArgumentsObject())
    {
        this->argObjSyms = fromData->argObjSyms;
    }
    this->maybeTempObjectSyms = fromData->maybeTempObjectSyms;
    this->canStoreTempObjectSyms = fromData->canStoreTempObjectSyms;
    this->curFunc = fromData->curFunc;

    this->valuesToKillOnCalls = fromData->valuesToKillOnCalls;
    this->inductionVariables = fromData->inductionVariables;
    this->availableIntBoundChecks = fromData->availableIntBoundChecks;
    this->callSequence = fromData->callSequence;

    this->startCallCount = fromData->startCallCount;
    this->argOutCount = fromData->argOutCount;
    this->totalOutParamCount = fromData->totalOutParamCount;
    this->inlinedArgOutSize = fromData->inlinedArgOutSize;
    this->hasCSECandidates = fromData->hasCSECandidates;

    this->stackLiteralInitFldDataMap = fromData->stackLiteralInitFldDataMap;

    this->changedSyms = fromData->changedSyms;
    this->capturedValues = fromData->capturedValues;
    if (this->capturedValues)
    {
        this->capturedValues->IncrementRefCount();
    }

    this->OnDataReused(fromData);
}